

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# islamcal.cpp
# Opt level: O1

void __thiscall
icu_63::IslamicCalendar::handleComputeFields
          (IslamicCalendar *this,int32_t julianDay,UErrorCode *status)

{
  UErrorCode UVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  int32_t iVar7;
  int32_t iVar8;
  int64_t iVar9;
  long lVar10;
  uint month;
  IslamicCalendar *this_00;
  int iVar11;
  long lVar12;
  int iVar13;
  uint year;
  ulong uVar14;
  
  iVar13 = julianDay + -0x1dbb18;
  iVar11 = *(int *)&(this->super_Calendar).field_0x264;
  month = 0;
  switch(iVar11) {
  case 0:
    dVar2 = uprv_floor_63((double)iVar13 / 29.530588853);
    dVar3 = uprv_floor_63((double)(int)dVar2 * 29.530588853);
    this_00 = (IslamicCalendar *)status;
    dVar4 = moonAge((this->super_Calendar).fTime,status);
    UVar1 = *status;
    if (UVar1 < U_ILLEGAL_ARGUMENT_ERROR) {
      iVar11 = (uint)(0.0 < dVar4 && 0x18 < iVar13 - (int)dVar3) + (int)dVar2;
      do {
        iVar6 = iVar11;
        iVar7 = trueMonthStart(this_00,iVar6);
        iVar11 = iVar6 + -1;
      } while (iVar13 < iVar7);
      iVar5 = iVar6 >> 0x1f;
      iVar11 = iVar6 / 0xc + iVar5;
      status = (UErrorCode *)(ulong)((iVar11 - iVar5) + 1);
      month = iVar6 + (iVar11 - iVar5) * -0xc;
    }
    else {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    year = (uint)status;
    if (U_ZERO_ERROR < UVar1) {
      return;
    }
    goto LAB_001f0623;
  case 1:
  case 3:
    if (iVar11 == 3) {
      iVar13 = julianDay + -0x1dbb17;
    }
    iVar9 = ClockMath::floorDivide((long)iVar13 * 0x1e + 0x2996,0x2987);
    year = (uint)iVar9;
    iVar11 = iVar13 + -0x1d;
    break;
  case 2:
    iVar7 = yearStart(this,0x514);
    if (iVar7 <= iVar13) {
      lVar12 = 1;
      uVar14 = 0x513;
      do {
        year = (uint)uVar14;
        if (lVar12 < 1) goto LAB_001f0587;
        year = year + 1;
        uVar14 = (ulong)year;
        iVar7 = yearStart(this,year);
        iVar11 = (iVar13 - iVar7) + 1;
        iVar6 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x23])(this,(ulong)year);
        if (iVar11 == iVar6) {
          month = 0xb;
          goto LAB_001f0623;
        }
        lVar12 = (long)iVar11;
        iVar6 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x23])(this,uVar14);
      } while (iVar6 <= iVar11);
      iVar11 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x22])(this,(ulong)year,0);
      if (iVar13 - iVar7 < iVar11) {
LAB_001f0587:
        month = 0;
      }
      else {
        lVar10 = (long)iVar11;
        month = 0;
        do {
          lVar12 = lVar12 - lVar10;
          month = month + 1;
          iVar11 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x22])
                             (this,(ulong)year,(ulong)month);
          lVar10 = (long)iVar11;
        } while (lVar10 < lVar12);
      }
      goto LAB_001f0623;
    }
    dVar2 = uprv_floor_63((double)(iVar13 * 0x1e + 0x2996) / 10631.0);
    year = (uint)dVar2;
    iVar11 = julianDay + -0x1dbb35;
    break;
  default:
    year = 0;
    goto LAB_001f0623;
  }
  iVar7 = yearStart(this,year);
  dVar2 = uprv_ceil_63((double)(iVar11 - iVar7) / 29.5);
  month = 0xb;
  if ((int)dVar2 < 0xb) {
    month = (int)dVar2;
  }
  monthStart(this,year,month);
LAB_001f0623:
  iVar7 = monthStart(this,year,month);
  iVar8 = monthStart(this,year,0);
  (this->super_Calendar).fFields[0] = 0;
  (this->super_Calendar).fStamp[0] = 1;
  (this->super_Calendar).fIsSet[0] = '\x01';
  (this->super_Calendar).fFields[1] = year;
  (this->super_Calendar).fStamp[1] = 1;
  (this->super_Calendar).fStamp[2] = 1;
  (this->super_Calendar).fIsSet[1] = '\x01';
  (this->super_Calendar).fIsSet[2] = '\x01';
  (this->super_Calendar).fFields[0x13] = year;
  (this->super_Calendar).fStamp[0x13] = 1;
  (this->super_Calendar).fIsSet[0x13] = '\x01';
  (this->super_Calendar).fFields[2] = month;
  (this->super_Calendar).fFields[5] = (iVar13 + 1) - iVar7;
  (this->super_Calendar).fStamp[5] = 1;
  (this->super_Calendar).fStamp[6] = 1;
  (this->super_Calendar).fIsSet[5] = '\x01';
  (this->super_Calendar).fIsSet[6] = '\x01';
  (this->super_Calendar).fFields[6] = (iVar13 + 1) - iVar8;
  return;
}

Assistant:

void IslamicCalendar::handleComputeFields(int32_t julianDay, UErrorCode &status) {
    int32_t year, month, dayOfMonth, dayOfYear;
    int32_t startDate;
    int32_t days = julianDay - CIVIL_EPOC;

    if (cType == CIVIL || cType == TBLA) {
        if(cType == TBLA) {
            days = julianDay - ASTRONOMICAL_EPOC;
        }
        // Use the civil calendar approximation, which is just arithmetic
        year  = (int32_t)ClockMath::floorDivide(30 * (int64_t)days + 10646, (int64_t)10631);
        month = (int32_t)uprv_ceil((days - 29 - yearStart(year)) / 29.5 );
        month = month<11?month:11;
        startDate = monthStart(year, month);
    } else if(cType == ASTRONOMICAL){
        // Guess at the number of elapsed full months since the epoch
        int32_t months = (int32_t)uprv_floor((double)days / CalendarAstronomer::SYNODIC_MONTH);

        startDate = (int32_t)uprv_floor(months * CalendarAstronomer::SYNODIC_MONTH);

        double age = moonAge(internalGetTime(), status);
        if (U_FAILURE(status)) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return;
        }
        if ( days - startDate >= 25 && age > 0) {
            // If we're near the end of the month, assume next month and search backwards
            months++;
        }

        // Find out the last time that the new moon was actually visible at this longitude
        // This returns midnight the night that the moon was visible at sunset.
        while ((startDate = trueMonthStart(months)) > days) {
            // If it was after the date in question, back up a month and try again
            months--;
        }

        year = months / 12 + 1;
        month = months % 12;
    } else if(cType == UMALQURA) {
        int32_t umalquraStartdays = yearStart(UMALQURA_YEAR_START) ;
        if( days < umalquraStartdays){
                //Use Civil calculation
                year  = (int)ClockMath::floorDivide( (double)(30 * days + 10646) , 10631.0 );
                month = (int32_t)uprv_ceil((days - 29 - yearStart(year)) / 29.5 );
                month = month<11?month:11;
                startDate = monthStart(year, month);
            }else{
                int y =UMALQURA_YEAR_START-1, m =0;
                long d = 1;
                while(d > 0){ 
                    y++; 
                    d = days - yearStart(y) +1;
                    if(d == handleGetYearLength(y)){
                        m=11;
                        break;
                    }else if(d < handleGetYearLength(y) ){
                        int monthLen = handleGetMonthLength(y, m); 
                        m=0;
                        while(d > monthLen){
                            d -= monthLen;
                            m++;
                            monthLen = handleGetMonthLength(y, m);
                        }
                        break;
                    }
                }
                year = y;
                month = m;
            }
    } else { // invalid 'civil'
      U_ASSERT(false); // should not get here, out of range
      year=month=0;
    }

    dayOfMonth = (days - monthStart(year, month)) + 1;

    // Now figure out the day of the year.
    dayOfYear = (days - monthStart(year, 0)) + 1;


    internalSet(UCAL_ERA, 0);
    internalSet(UCAL_YEAR, year);
    internalSet(UCAL_EXTENDED_YEAR, year);
    internalSet(UCAL_MONTH, month);
    internalSet(UCAL_DAY_OF_MONTH, dayOfMonth);
    internalSet(UCAL_DAY_OF_YEAR, dayOfYear);       
}